

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

void __thiscall
obx::Tree::putAsync(Tree *this,char *path,void *data,size_t size,OBXPropertyType type,void *metadata
                   ,size_t metadata_size,OBXPutMode dataPutMode,
                   function<void_(const_obx::AsyncTreePutResult_&)> callback)

{
  obx_err err;
  function<void_(const_obx::AsyncTreePutResult_&)> *this_00;
  code *pcVar1;
  undefined4 in_register_00000084;
  ulong uVar2;
  
  uVar2 = CONCAT44(in_register_00000084,type);
  if (*(long *)(callback.super__Function_base._M_functor._M_unused._M_function_pointer + 0x10) == 0)
  {
    pcVar1 = (code *)0x0;
    this_00 = (function<void_(const_obx::AsyncTreePutResult_&)> *)0x0;
  }
  else {
    this_00 = (function<void_(const_obx::AsyncTreePutResult_&)> *)operator_new(0x20);
    std::function<void_(const_obx::AsyncTreePutResult_&)>::function
              (this_00,(function<void_(const_obx::AsyncTreePutResult_&)> *)
                       callback.super__Function_base._M_functor._M_unused._0_8_);
    uVar2 = (ulong)type;
    pcVar1 = anon_unknown_3::cCallbackTrampolineAsyncTreePut;
  }
  err = obx_tree_async_put_raw
                  (*(undefined8 *)this,path,data,size,uVar2,metadata,metadata_size,dataPutMode,
                   pcVar1,this_00);
  internal::checkErrOrThrow(err);
  return;
}

Assistant:

void Tree::putAsync(const char* path, void* data, size_t size, OBXPropertyType type, void* metadata,
                    size_t metadata_size, OBXPutMode dataPutMode,
                    std::function<void(const AsyncTreePutResult& result)> callback) {
    bool hasCallback = callback != nullptr;
    auto funPtr = hasCallback ? new std::function<void(const AsyncTreePutResult&)>(std::move(callback)) : nullptr;
    obx_tree_async_put_callback* cCallback = hasCallback ? cCallbackTrampolineAsyncTreePut : nullptr;
    obx_err err =
        obx_tree_async_put_raw(cTree_, path, data, size, type, metadata, metadata_size, dataPutMode, cCallback, funPtr);
    internal::checkErrOrThrow(err);
}